

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3843.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementHexaANCF_3843::ComputeGravityForces(ChElementHexaANCF_3843 *this)

{
  ChVector<double> *in_RDX;
  ChVectorDynamic<> *in_RSI;
  
  ComputeGravityForces((ChElementHexaANCF_3843 *)&this[-1].field_0x15f8,in_RSI,in_RDX);
  return;
}

Assistant:

void ChElementHexaANCF_3843::ComputeGravityForces(ChVectorDynamic<>& Fg, const ChVector<>& G_acc) {
    assert(Fg.size() == 3 * NSF);

    // Calculate and add the generalized force due to gravity to the generalized internal force vector for the element.
    // The generalized force due to gravity could be computed once prior to the start of the simulation if gravity was
    // assumed constant throughout the entire simulation.  However, this implementation assumes that the acceleration
    // due to gravity, while a constant for the entire system, can change from step to step which could be useful for
    // gravity loaded units tests as an example.  The generalized force due to gravity is calculated in compact matrix
    // form and is pre-mapped to the desired vector format
    Eigen::Map<MatrixNx3> GravForceCompact(Fg.data(), NSF, 3);
    GravForceCompact = m_GravForceScale * G_acc.eigen().transpose();
}